

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O1

bool tchecker::refdbm::is_sync_alu_le
               (db_t *rdbm1,db_t *rdbm2,reference_clock_variables_t *r,integer_t *l,integer_t *u)

{
  uint uVar1;
  db_t dVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  db_t dVar6;
  uint uVar7;
  invalid_argument *this;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  db_t *pdVar12;
  int iVar13;
  long lVar14;
  db_t *pdVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  bool local_99;
  db_t local_74;
  long local_70;
  db_t *local_68;
  db_t *local_60;
  db_t *local_58;
  db_t *local_50;
  integer_t *local_48;
  db_t *local_40;
  integer_t *local_38;
  
  local_48 = u;
  local_38 = l;
  if (rdbm1 == (db_t *)0x0) {
    __assert_fail("rdbm1 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x198,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  if (rdbm2 == (db_t *)0x0) {
    __assert_fail("rdbm2 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x199,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar5 = is_consistent(rdbm1,r);
  if (!bVar5) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19a,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar5 = is_consistent(rdbm2,r);
  if (!bVar5) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19b,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar5 = is_positive(rdbm1,r);
  if (!bVar5) {
    __assert_fail("tchecker::refdbm::is_positive(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19c,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar5 = is_positive(rdbm2,r);
  if (!bVar5) {
    __assert_fail("tchecker::refdbm::is_positive(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19d,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar5 = is_tight(rdbm1,r);
  if (!bVar5) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19e,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar5 = is_tight(rdbm2,r);
  if (!bVar5) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19f,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  uVar4 = *(stored_size_type *)
           ((long)&(r->super_flat_clock_variables_t).
                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map.m_flat_tree.m_data + 8);
  if (uVar4 != *(stored_size_type *)
                ((long)&(r->super_flat_clock_variables_t).
                        super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._index._value_map.m_flat_tree.m_data + 8)) {
    __assert_fail("_key_map.size() == _value_map.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                  ,0x90,
                  "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
                 );
  }
  uVar1 = r->_refcount;
  uVar9 = (ulong)uVar1;
  local_99 = uVar4 <= uVar9;
  if (uVar9 < uVar4) {
    local_58 = rdbm1 + uVar4;
    local_70 = uVar9 - 1;
    local_68 = rdbm2 + uVar4;
    iVar8 = 0;
    uVar17 = (ulong)uVar1;
    local_60 = rdbm2;
    do {
      iVar10 = local_48[uVar17 - uVar9];
      if (0x3ffffffe < iVar10) {
        __assert_fail("Ux < tchecker::dbm::INF_VALUE",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                      ,0x1b7,
                      "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                     );
      }
      uVar7 = 0;
      uVar16 = (uint)uVar17;
      if (iVar10 != -0x3fffffff) {
        local_40 = rdbm1 + uVar17;
        pdVar12 = local_40;
        if (uVar16 < uVar1) {
          pdVar12 = (db_t *)&tchecker::dbm::LT_INFINITY;
        }
        dVar6 = *pdVar12;
        if (1 < uVar1) {
          pdVar12 = local_58 + uVar17;
          lVar14 = local_70;
          do {
            pdVar15 = pdVar12;
            if (uVar16 < uVar1) {
              pdVar15 = (db_t *)&tchecker::dbm::LT_INFINITY;
            }
            dVar2 = *pdVar15;
            bVar5 = (int)dVar6 >> 1 < (int)dVar2 >> 1;
            if ((int)dVar6 >> 1 == (int)dVar2 >> 1) {
              bVar5 = ((uint)dVar6 & 1) <= ((uint)dVar2 & 1);
            }
            if (!bVar5) {
              dVar6 = dVar2;
            }
            pdVar12 = pdVar12 + uVar4;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        if (iVar10 + 0xbfffffffU < 0x80000001) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"value out of bounds");
LAB_0014cdc6:
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        iVar19 = (int)dVar6 >> 1;
        iVar10 = iVar10 * -2 >> 1;
        uVar20 = (uint)dVar6 & 1;
        bVar5 = uVar20 == 0;
        if (iVar19 != iVar10) {
          bVar5 = iVar19 < iVar10;
        }
        if (!bVar5) {
          local_50 = local_60 + uVar17;
          pdVar12 = local_50;
          if (uVar16 < uVar1) {
            pdVar12 = (db_t *)&tchecker::dbm::LT_INFINITY;
          }
          dVar6 = *pdVar12;
          if (1 < uVar1) {
            pdVar12 = local_68 + uVar17;
            lVar14 = local_70;
            do {
              pdVar15 = pdVar12;
              if (uVar16 < uVar1) {
                pdVar15 = (db_t *)&tchecker::dbm::LT_INFINITY;
              }
              dVar2 = *pdVar15;
              bVar5 = (int)dVar6 >> 1 < (int)dVar2 >> 1;
              if ((int)dVar6 >> 1 == (int)dVar2 >> 1) {
                bVar5 = ((uint)dVar6 & 1) <= ((uint)dVar2 & 1);
              }
              if (!bVar5) {
                dVar6 = dVar2;
              }
              pdVar12 = pdVar12 + uVar4;
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
          bVar5 = (int)dVar6 >> 1 < iVar19;
          if ((int)dVar6 >> 1 == iVar19) {
            bVar5 = ((uint)dVar6 & 1) < uVar20;
          }
          uVar7 = 1;
          uVar18 = uVar1;
          uVar17 = uVar9;
          iVar10 = iVar8;
          if (!bVar5) {
            while (uVar17 < uVar4) {
              uVar18 = uVar18 + 1;
              iVar3 = local_38[uVar17 - uVar9];
              if (0x3ffffffe < iVar3) {
                __assert_fail("Ly < tchecker::dbm::INF_VALUE",
                              "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                              ,0x1d1,
                              "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                             );
              }
              uVar7 = 0xd;
              if ((iVar10 != 0) && (iVar3 != -0x3fffffff)) {
                pdVar12 = local_50 + uVar17 * uVar4;
                if (uVar16 < uVar1) {
                  pdVar12 = (db_t *)&tchecker::dbm::LT_INFINITY;
                }
                pdVar15 = local_40 + uVar17 * uVar4;
                if (uVar16 < uVar1) {
                  pdVar15 = (db_t *)&tchecker::dbm::LT_INFINITY;
                }
                iVar11 = (int)*pdVar12 >> 1;
                iVar13 = (int)*pdVar15 >> 1;
                bVar5 = iVar11 < iVar13;
                if (iVar11 == iVar13) {
                  bVar5 = ((uint)*pdVar12 & 1) < ((uint)*pdVar15 & 1);
                }
                if (bVar5) {
                  if (iVar3 + 0xbfffffffU < 0x80000001) {
                    this = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument(this,"value out of bounds");
                    goto LAB_0014cdc6;
                  }
                  local_74 = (db_t)(iVar3 * -2);
                  dVar6 = tchecker::dbm::sum(pdVar12,&local_74);
                  bVar5 = (int)dVar6 >> 1 < iVar19;
                  if ((int)dVar6 >> 1 == iVar19) {
                    bVar5 = ((uint)dVar6 & 1) < uVar20;
                  }
                  uVar7 = 1;
                  if (bVar5) goto LAB_0014ccf3;
                }
                uVar7 = 0;
              }
LAB_0014ccf3:
              if ((uVar7 != 0xd) && (uVar7 != 0)) goto LAB_0014cd10;
              iVar10 = iVar10 + -1;
              uVar17 = (ulong)uVar18;
            }
            uVar7 = 0xb;
LAB_0014cd10:
            if (uVar7 == 0xb) {
              uVar7 = 0;
            }
          }
        }
      }
      if ((uVar7 & 0xb) != 0) {
        return local_99;
      }
      uVar17 = (ulong)(uVar16 + 1);
      iVar8 = iVar8 + 1;
      local_99 = uVar4 <= uVar17;
    } while (uVar17 < uVar4);
  }
  return local_99;
}

Assistant:

bool is_sync_alu_le(tchecker::dbm::db_t const * rdbm1, tchecker::dbm::db_t const * rdbm2,
                    tchecker::reference_clock_variables_t const & r, tchecker::integer_t const * l,
                    tchecker::integer_t const * u)
{
  assert(rdbm1 != nullptr);
  assert(rdbm2 != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm1, r));
  assert(tchecker::refdbm::is_consistent(rdbm2, r));
  assert(tchecker::refdbm::is_positive(rdbm1, r));
  assert(tchecker::refdbm::is_positive(rdbm2, r));
  assert(tchecker::refdbm::is_tight(rdbm1, r));
  assert(tchecker::refdbm::is_tight(rdbm2, r));

  // We apply the technique described in appendix C of Govind Rajanbabu's PhD thesis
  // "Partial-order reduction for timed automata", Université de Bordeaux, 2021
  //
  // let dbm1=local_time_elapse(rdbm1), dbm2=local_time_elapse(rdbm2)
  //
  // Let min_tx1 = min {dbm1[t,x] | t ref clock, x offset clock}
  // and min_tx2 = min {dbm2[t,x] | t ref clock, x offset clock}
  //
  // dbm1 not included in aLU(dbm2) if:
  // - either there is an offset clock x s.t.
  //     min_tx1 >= (<= -U(x))
  // &&  min_tx2 < min_tx1
  // - or there are two offset clocks x and y s.t.
  //     min_tx1 >= (<= -U(x))
  // &&  dbm2[y,x] < dbm1[y,x]
  // &&  dbm2[y,x] + (< -L(y)) < min_tx1

  std::size_t const rdim = r.size();
  std::size_t const refcount = r.refcount();

  for (tchecker::clock_id_t x = refcount; x < rdim; ++x) {
    tchecker::integer_t Ux = U(x);
    assert(Ux < tchecker::dbm::INF_VALUE);

    // Skip x as 1st condition cannot be satisfied
    if (Ux == -tchecker::dbm::INF_VALUE)
      continue;

    // Compute min_tx1 = min {dbm1[t,x] | t ref clock}
    tchecker::dbm::db_t min_tx1 = LTE_RDBM1(0, x);
    for (tchecker::clock_id_t t = 1; t < refcount; ++t)
      min_tx1 = tchecker::dbm::min(min_tx1, LTE_RDBM1(t, x));

    // Check 1st condition
    if (min_tx1 < tchecker::dbm::db(tchecker::LE, -Ux))
      continue;

    // Compute min_tx2 = min {dbm2[t,x] | t ref clock}
    tchecker::dbm::db_t min_tx2 = LTE_RDBM2(0, x);
    for (tchecker::clock_id_t t = 1; t < refcount; ++t)
      min_tx2 = tchecker::dbm::min(min_tx2, LTE_RDBM2(t, x));

    // Check 2nd condition (of first case above)
    if (min_tx2 < min_tx1)
      return false;

    for (tchecker::clock_id_t y = refcount; y < rdim; ++y) {
      tchecker::integer_t Ly = L(y);
      assert(Ly < tchecker::dbm::INF_VALUE);

      if (x == y)
        continue;

      // Skip y as 3rd condition cannot be satisfied
      if (Ly == -tchecker::dbm::INF_VALUE)
        continue;

      // Check 2nd and 3rd conditions (of second case above)
      if (LTE_RDBM2(y, x) < LTE_RDBM1(y, x) &&
          tchecker::dbm::sum(LTE_RDBM2(y, x), tchecker::dbm::db(tchecker::LT, -Ly)) < min_tx1)
        return false;
    }
  }

  return true;
}